

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::commandProcessFinished
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,
          ProcessResult *commandResult)

{
  undefined1 local_50 [8];
  llb_buildsystem_command_extended_result_t result;
  ProcessResult *commandResult_local;
  Command *command_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  ProcessHandle handle_local;
  
  if ((this->cAPIDelegate).command_process_finished !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_buildsystem_command_extended_result_t_ptr
       *)0x0) {
    result._32_8_ = commandResult;
    local_50._0_4_ = get_command_result(commandResult->status);
    local_50._4_4_ = *(int *)(result._32_8_ + 4);
    result.maxrss._0_4_ = *(undefined4 *)(result._32_8_ + 8);
    result._0_8_ = *(undefined8 *)(result._32_8_ + 0x10);
    result.utime = *(uint64_t *)(result._32_8_ + 0x18);
    result.stime = *(uint64_t *)(result._32_8_ + 0x20);
    (*(this->cAPIDelegate).command_process_finished)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
               (llb_buildsystem_process_t *)handle.id,
               (llb_buildsystem_command_extended_result_t *)local_50);
  }
  return;
}

Assistant:

virtual void commandProcessFinished(Command* command, ProcessHandle handle,
                                      const ProcessResult& commandResult) override {
    if (cAPIDelegate.command_process_finished) {
      llb_buildsystem_command_extended_result_t result;
      result.result = get_command_result(commandResult.status);
      result.exit_status = commandResult.exitCode;
      result.pid = commandResult.pid;
      result.utime = commandResult.utime;
      result.stime = commandResult.stime;
      result.maxrss = commandResult.maxrss;

      cAPIDelegate.command_process_finished(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          (llb_buildsystem_process_t*) handle.id,
          &result);
    }
  }